

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O0

void __thiscall FStringTable::SetString(FStringTable *this,char *name,char *newString)

{
  size_t sVar1;
  size_t sVar2;
  StringEntry *pSVar3;
  StringEntry *entry;
  size_t namelen;
  size_t newlen;
  StringEntry *oentry;
  StringEntry **pentry;
  char *newString_local;
  char *name_local;
  FStringTable *this_local;
  
  pentry = (StringEntry **)newString;
  newString_local = name;
  name_local = (char *)this;
  FindString(this,name,(StringEntry ***)&oentry,(StringEntry **)&newlen);
  sVar1 = strlen((char *)pentry);
  sVar2 = strlen(newString_local);
  pSVar3 = (StringEntry *)
           M_Malloc_Dbg(sVar1 + sVar2 + 0x1a,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/stringtable.cpp"
                        ,0x19c);
  strcpy(&pSVar3->field_0x11,(char *)pentry);
  pSVar3->Name = &pSVar3->field_0x12 + sVar1;
  strcpy(&pSVar3->field_0x12 + sVar1,newString_local);
  pSVar3->PassNum = '\0';
  if (newlen == 0) {
    pSVar3->Next = oentry->Next;
    oentry->Next = pSVar3;
  }
  else {
    oentry->Next = pSVar3;
    pSVar3->Next = *(StringEntry **)newlen;
    M_Free((void *)newlen);
  }
  return;
}

Assistant:

void FStringTable::SetString (const char *name, const char *newString)
{
	StringEntry **pentry, *oentry;
	FindString (name, pentry, oentry);

	size_t newlen = strlen (newString);
	size_t namelen = strlen (name);

	// Create a new string entry
	StringEntry *entry = (StringEntry *)M_Malloc (sizeof(*entry) + newlen + namelen + 2);
	strcpy (entry->String, newString);
	strcpy (entry->Name = entry->String + newlen + 1, name);
	entry->PassNum = 0;

	// If this is a new string, insert it. Otherwise, replace the old one.
	if (oentry == NULL)
	{
		entry->Next = *pentry;
		*pentry = entry;
	}
	else
	{
		*pentry = entry;
		entry->Next = oentry->Next;
		M_Free (oentry);
	}
}